

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::ProductionSyntax::ProductionSyntax
          (ProductionSyntax *this,DataTypeSyntax *dataType,Token name,
          FunctionPortListSyntax *portList,Token colon,
          SeparatedSyntaxList<slang::syntax::RsRuleSyntax> *rules,Token semi)

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  RsRuleSyntax *pRVar4;
  undefined8 uVar5;
  SeparatedSyntaxList<slang::syntax::RsRuleSyntax> *__range2;
  iterator_base<slang::syntax::RsRuleSyntax_*> local_30;
  
  uVar5 = name._0_8_;
  (this->super_SyntaxNode).kind = Production;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  this->dataType = dataType;
  (this->name).kind = (short)uVar5;
  (this->name).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->name).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->name).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->name).info = name.info;
  this->portList = portList;
  (this->colon).kind = colon.kind;
  (this->colon).field_0x2 = colon._2_1_;
  (this->colon).numFlags = (NumericTokenFlags)colon.numFlags.raw;
  (this->colon).rawLen = colon.rawLen;
  (this->colon).info = colon.info;
  uVar3 = *(undefined4 *)&(rules->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (rules->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->rules).super_SyntaxListBase.super_SyntaxNode.kind =
       (rules->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->rules).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->rules).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->rules).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (rules->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->rules).super_SyntaxListBase.childCount = (rules->super_SyntaxListBase).childCount;
  (this->rules).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0057ecd0;
  sVar1 = (rules->elements)._M_extent._M_extent_value;
  (this->rules).elements._M_ptr = (rules->elements)._M_ptr;
  (this->rules).elements._M_extent._M_extent_value = sVar1;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  if (dataType != (DataTypeSyntax *)0x0) {
    (dataType->super_ExpressionSyntax).super_SyntaxNode.parent = &this->super_SyntaxNode;
  }
  if (portList != (FunctionPortListSyntax *)0x0) {
    (portList->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  (this->rules).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  local_30.index = 0;
  sVar1 = (this->rules).elements._M_extent._M_extent_value;
  local_30.list = &this->rules;
  for (; (local_30.list != &this->rules || (local_30.index != sVar1 + 1 >> 1));
      local_30.index = local_30.index + 1) {
    pRVar4 = SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::
             iterator_base<slang::syntax::RsRuleSyntax_*>::dereference(&local_30);
    (pRVar4->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  return;
}

Assistant:

ProductionSyntax(DataTypeSyntax* dataType, Token name, FunctionPortListSyntax* portList, Token colon, const SeparatedSyntaxList<RsRuleSyntax>& rules, Token semi) :
        SyntaxNode(SyntaxKind::Production), dataType(dataType), name(name), portList(portList), colon(colon), rules(rules), semi(semi) {
        if (this->dataType) this->dataType->parent = this;
        if (this->portList) this->portList->parent = this;
        this->rules.parent = this;
        for (auto child : this->rules)
            child->parent = this;
    }